

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void duckdb::Node::TransformToDeprecated
               (ART *art,Node *node,
               unsafe_unique_ptr<FixedSizeAllocator> *deprecated_prefix_allocator)

{
  Node ptr;
  unsafe_optional_ptr<duckdb::Node4> ptr_00;
  unsafe_optional_ptr<duckdb::Node48> ptr_01;
  unsafe_optional_ptr<duckdb::Node256> ptr_02;
  unsafe_optional_ptr<duckdb::Node16> ptr_03;
  InternalException *this;
  allocator local_61;
  string local_60;
  string local_40;
  
  ptr = (Node)(node->super_IndexPointer).data;
  if (-1 < (long)ptr.super_IndexPointer.data) {
    switch(ptr.super_IndexPointer.data._7_1_) {
    case PREFIX:
      Prefix::TransformToDeprecated(art,node,deprecated_prefix_allocator);
      return;
    case LEAF:
    case LEAF_INLINED:
      return;
    case NODE_4:
      ptr_00 = InMemoryRef<duckdb::Node4>(art,ptr,NODE_4);
      TransformToDeprecatedInternal<duckdb::Node4>(art,ptr_00,deprecated_prefix_allocator);
      return;
    case NODE_16:
      ptr_03 = InMemoryRef<duckdb::Node16>(art,ptr,NODE_16);
      TransformToDeprecatedInternal<duckdb::Node16>(art,ptr_03,deprecated_prefix_allocator);
      return;
    case NODE_48:
      ptr_01 = InMemoryRef<duckdb::Node48>(art,ptr,NODE_48);
      TransformToDeprecatedInternal<duckdb::Node48>(art,ptr_01,deprecated_prefix_allocator);
      return;
    case NODE_256:
      ptr_02 = InMemoryRef<duckdb::Node256>(art,ptr,NODE_256);
      TransformToDeprecatedInternal<duckdb::Node256>(art,ptr_02,deprecated_prefix_allocator);
      return;
    default:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_40,"invalid node type for TransformToDeprecated: %s",&local_61);
      EnumUtil::ToString<duckdb::NType>(&local_60,ptr.super_IndexPointer.data._7_1_);
      InternalException::InternalException<std::__cxx11::string>(this,&local_40,&local_60);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  Leaf::TransformToDeprecated(art,node);
  return;
}

Assistant:

void Node::TransformToDeprecated(ART &art, Node &node,
                                 unsafe_unique_ptr<FixedSizeAllocator> &deprecated_prefix_allocator) {
	D_ASSERT(node.HasMetadata());

	if (node.GetGateStatus() == GateStatus::GATE_SET) {
		D_ASSERT(node.GetType() != NType::LEAF_INLINED);
		return Leaf::TransformToDeprecated(art, node);
	}

	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::TransformToDeprecated(art, node, deprecated_prefix_allocator);
	case NType::LEAF_INLINED:
		return;
	case NType::LEAF:
		return;
	case NType::NODE_4:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node4>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_16:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node16>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_48:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node48>(art, node, type), deprecated_prefix_allocator);
	case NType::NODE_256:
		return TransformToDeprecatedInternal(art, InMemoryRef<Node256>(art, node, type), deprecated_prefix_allocator);
	default:
		throw InternalException("invalid node type for TransformToDeprecated: %s", EnumUtil::ToString(type));
	}
}